

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-virt.c
# Opt level: O0

char * string_append(char *s1,char *s2)

{
  size_t sVar1;
  size_t sVar2;
  size_t len;
  char *s2_local;
  char *s1_local;
  
  if ((s1 == (char *)0x0) && (s2 == (char *)0x0)) {
    s1_local = (char *)0x0;
  }
  else if ((s1 == (char *)0x0) || (s1_local = s1, s2 != (char *)0x0)) {
    if ((s1 == (char *)0x0) && (s2 != (char *)0x0)) {
      s1_local = string_make(s2);
    }
    else {
      sVar1 = strlen(s1);
      sVar2 = strlen(s2);
      s1_local = (char *)mem_realloc(s1,sVar1 + sVar2 + 1);
      sVar2 = strlen(s2);
      my_strcpy(s1_local + sVar1,s2,sVar2 + 1);
    }
  }
  return s1_local;
}

Assistant:

char *string_append(char *s1, const char *s2)
{
	size_t len;
	if (!s1 && !s2) {
		return NULL;
	} else if (s1 && !s2) {
		return s1;
	} else if (!s1 && s2) {
		return string_make(s2);
	}
	len = strlen(s1);
	s1 = mem_realloc(s1, len + strlen(s2) + 1);
	my_strcpy(s1 + len, s2, strlen(s2) + 1);
	return s1;
}